

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
          (TPZMultiphysicsCompMesh *this,TPZVec<TPZCompMesh_*> *mesh_vector,TPZVec<long> *gelindexes
          )

{
  int *piVar1;
  long lVar2;
  long lVar3;
  TPZManVector<TPZCompMesh_*,_7> local_70;
  
  TPZManVector<TPZCompMesh_*,_7>::TPZManVector(&local_70,mesh_vector);
  TPZManVector<TPZCompMesh_*,_7>::operator=(&this->m_mesh_vector,&local_70);
  TPZManVector<TPZCompMesh_*,_7>::~TPZManVector(&local_70);
  TPZManVector<int,_5>::Resize
            (&this->m_active_approx_spaces,
             (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNElements);
  piVar1 = (this->m_active_approx_spaces).super_TPZVec<int>.fStore;
  lVar2 = (this->m_active_approx_spaces).super_TPZVec<int>.fNElements;
  for (lVar3 = 0; lVar3 < lVar2; lVar3 = lVar3 + 1) {
    piVar1[lVar3] = 1;
  }
  (this->super_TPZCompMesh).fNmeshes =
       (long)(int)(this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNElements;
  TPZGeoMesh::ResetReference((this->super_TPZCompMesh).fReference);
  CleanElementsConnects(this);
  TPZCompMesh::AutoBuild(&this->super_TPZCompMesh,gelindexes);
  AddElements(this);
  AddConnects(this);
  LoadSolutionFromMeshes(this);
  return;
}

Assistant:

void TPZMultiphysicsCompMesh::BuildMultiphysicsSpace(TPZVec<TPZCompMesh * > & mesh_vector, const TPZVec<int64_t> &gelindexes){
    
    m_mesh_vector          = mesh_vector;
    m_active_approx_spaces.Resize(m_mesh_vector.size());
    for(int64_t i = 0; i< m_active_approx_spaces.size(); i++) m_active_approx_spaces[i] = 1;
    int n_approx_spaces = m_mesh_vector.size();
    SetNMeshes(n_approx_spaces);
    Reference()->ResetReference();
    // if(ApproxSpace().Style() != TPZCreateApproximationSpace::EMultiphysics)
    // {
    //     std::cout << __PRETTY_FUNCTION__ << " Modifying the style of approximation space "
    //     " to multiphysics\n";
    //     SetAllCreateFunctionsMultiphysicElem();
    // }
    // delete all elements and connects in the mesh
    CleanElementsConnects();
    TPZCompMesh::AutoBuild(gelindexes);
    AddElements();
    AddConnects();
    LoadSolutionFromMeshes();
}